

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpapi_curl.c
# Opt level: O0

HTTPAPI_RESULT HTTPAPI_SetOption(HTTP_HANDLE handle,char *optionName,void *value)

{
  OPTION_OPENSSL_KEY_TYPE OVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  size_t sVar4;
  size_t sVar5;
  undefined8 in_stack_fffffffffffffe98;
  undefined4 uVar6;
  size_t local_160;
  ulong local_150;
  LOGGER_LOG l_17;
  LOGGER_LOG l_16;
  LOGGER_LOG l_15;
  char *interfaceName;
  LOGGER_LOG l_14;
  LOGGER_LOG l_13;
  LOGGER_LOG l_12;
  LOGGER_LOG l_11;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  size_t authLen;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  HTTP_PROXY_OPTIONS *proxy_data;
  char *proxy_auth;
  char proxy [65];
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  OPTION_OPENSSL_KEY_TYPE type;
  long timeout;
  HTTP_HANDLE_DATA *httpHandleData;
  LOGGER_LOG l;
  HTTPAPI_RESULT result;
  void *value_local;
  char *optionName_local;
  HTTP_HANDLE handle_local;
  
  uVar6 = (undefined4)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  if (((handle == (HTTP_HANDLE)0x0) || (optionName == (char *)0x0)) || (value == (void *)0x0)) {
    l._4_4_ = HTTPAPI_INVALID_ARG;
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                ,"HTTPAPI_SetOption",0x385,1,"invalid parameter (NULL) passed to HTTPAPI_SetOption")
      ;
    }
  }
  else {
    iVar2 = strcmp("timeout",optionName);
    if (iVar2 == 0) {
      handle->timeout = (ulong)*value;
      l._4_4_ = HTTPAPI_OK;
    }
    else {
      iVar2 = strcmp("CURLOPT_LOW_SPEED_LIMIT",optionName);
      if (iVar2 == 0) {
        handle->lowSpeedLimit = *value;
        l._4_4_ = HTTPAPI_OK;
      }
      else {
        iVar2 = strcmp("CURLOPT_LOW_SPEED_TIME",optionName);
        if (iVar2 == 0) {
          handle->lowSpeedTime = *value;
          l._4_4_ = HTTPAPI_OK;
        }
        else {
          iVar2 = strcmp("CURLOPT_FRESH_CONNECT",optionName);
          if (iVar2 == 0) {
            handle->freshConnect = *value;
            l._4_4_ = HTTPAPI_OK;
          }
          else {
            iVar2 = strcmp("CURLOPT_FORBID_REUSE",optionName);
            if (iVar2 == 0) {
              handle->forbidReuse = *value;
              l._4_4_ = HTTPAPI_OK;
            }
            else {
              iVar2 = strcmp("CURLOPT_VERBOSE",optionName);
              if (iVar2 == 0) {
                handle->verbose = *value;
                l._4_4_ = HTTPAPI_OK;
              }
              else {
                iVar2 = strcmp("x509PrivatekeyType",optionName);
                if (iVar2 == 0) {
                  OVar1 = *value;
                  if ((OVar1 == KEY_TYPE_DEFAULT) || (OVar1 == KEY_TYPE_ENGINE)) {
                    handle->x509privatekeytype = OVar1;
                    l._4_4_ = HTTPAPI_OK;
                  }
                  else {
                    p_Var3 = xlogging_get_log_function();
                    if (p_Var3 != (LOGGER_LOG)0x0) {
                      (*p_Var3)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                ,"HTTPAPI_SetOption",0x3b4,1,"Unknown x509PrivatekeyType: %i",
                                CONCAT44(uVar6,OVar1));
                    }
                    l._4_4_ = HTTPAPI_ERROR;
                  }
                }
                else {
                  iVar2 = strcmp("Engine",optionName);
                  if (iVar2 == 0) {
                    iVar2 = mallocAndStrcpy_s(&handle->engineId,(char *)value);
                    if (iVar2 == 0) {
                      l._4_4_ = HTTPAPI_OK;
                    }
                    else {
                      p_Var3 = xlogging_get_log_function();
                      if (p_Var3 != (LOGGER_LOG)0x0) {
                        (*p_Var3)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                  ,"HTTPAPI_SetOption",0x3bd,1,
                                  "unable to mallocAndStrcpy_s x509PrivatekeyType");
                      }
                      l._4_4_ = HTTPAPI_ERROR;
                    }
                  }
                  else {
                    iVar2 = strcmp("x509privatekey",optionName);
                    if ((iVar2 == 0) || (iVar2 = strcmp("x509EccAliasKey",optionName), iVar2 == 0))
                    {
                      handle->x509privatekey = (char *)value;
                      if (handle->x509certificate == (char *)0x0) {
                        l._4_4_ = HTTPAPI_OK;
                      }
                      else {
                        iVar2 = curl_easy_setopt(handle->curl,0x4e8c,ssl_ctx_callback);
                        if (iVar2 == 0) {
                          iVar2 = curl_easy_setopt(handle->curl,0x277d,handle);
                          if (iVar2 == 0) {
                            l._4_4_ = HTTPAPI_OK;
                          }
                          else {
                            p_Var3 = xlogging_get_log_function();
                            if (p_Var3 != (LOGGER_LOG)0x0) {
                              (*p_Var3)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                        ,"HTTPAPI_SetOption",0x3d5,1,"unable to curl_easy_setopt");
                            }
                            l._4_4_ = HTTPAPI_ERROR;
                          }
                        }
                        else {
                          p_Var3 = xlogging_get_log_function();
                          if (p_Var3 != (LOGGER_LOG)0x0) {
                            (*p_Var3)(AZ_LOG_ERROR,
                                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                      ,"HTTPAPI_SetOption",0x3ce,1,"unable to curl_easy_setopt");
                          }
                          l._4_4_ = HTTPAPI_ERROR;
                        }
                      }
                    }
                    else {
                      iVar2 = strcmp("x509certificate",optionName);
                      if ((iVar2 == 0) ||
                         (iVar2 = strcmp("x509EccCertificate",optionName), iVar2 == 0)) {
                        handle->x509certificate = (char *)value;
                        if (handle->x509privatekey == (char *)0x0) {
                          l._4_4_ = HTTPAPI_OK;
                        }
                        else {
                          iVar2 = curl_easy_setopt(handle->curl,0x4e8c,ssl_ctx_callback);
                          if (iVar2 == 0) {
                            iVar2 = curl_easy_setopt(handle->curl,0x277d,handle);
                            if (iVar2 == 0) {
                              l._4_4_ = HTTPAPI_OK;
                            }
                            else {
                              p_Var3 = xlogging_get_log_function();
                              if (p_Var3 != (LOGGER_LOG)0x0) {
                                (*p_Var3)(AZ_LOG_ERROR,
                                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                          ,"HTTPAPI_SetOption",0x3f2,1,"unable to curl_easy_setopt")
                                ;
                              }
                              l._4_4_ = HTTPAPI_ERROR;
                            }
                          }
                          else {
                            p_Var3 = xlogging_get_log_function();
                            if (p_Var3 != (LOGGER_LOG)0x0) {
                              (*p_Var3)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                        ,"HTTPAPI_SetOption",0x3eb,1,"unable to curl_easy_setopt");
                            }
                            l._4_4_ = HTTPAPI_ERROR;
                          }
                        }
                      }
                      else {
                        iVar2 = strcmp("proxy_data",optionName);
                        if (iVar2 == 0) {
                          iVar2 = sprintf_s((char *)&proxy_auth,0x41,"%s:%d",*value,
                                            (ulong)*(uint *)((long)value + 8));
                          if (iVar2 < 1) {
                            p_Var3 = xlogging_get_log_function();
                            if (p_Var3 != (LOGGER_LOG)0x0) {
                              (*p_Var3)(AZ_LOG_ERROR,
                                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                        ,"HTTPAPI_SetOption",0x40a,1,
                                        "failure constructing proxy address");
                            }
                            l._4_4_ = HTTPAPI_ERROR;
                          }
                          else {
                            iVar2 = curl_easy_setopt(handle->curl,0x2714,&proxy_auth);
                            if (iVar2 == 0) {
                              if ((*(long *)((long)value + 0x10) == 0) ||
                                 (*(long *)((long)value + 0x18) == 0)) {
                                l._4_4_ = HTTPAPI_OK;
                              }
                              else {
                                sVar4 = strlen(*(char **)((long)value + 0x10));
                                sVar5 = strlen(*(char **)((long)value + 0x18));
                                if (sVar4 < -sVar5 - 1) {
                                  sVar4 = strlen(*(char **)((long)value + 0x10));
                                  sVar5 = strlen(*(char **)((long)value + 0x18));
                                  local_150 = sVar4 + sVar5;
                                }
                                else {
                                  local_150 = 0xffffffffffffffff;
                                }
                                if (local_150 < 0xfffffffffffffffd) {
                                  local_160 = local_150 + 2;
                                }
                                else {
                                  local_160 = 0xffffffffffffffff;
                                }
                                if (local_160 == 0xffffffffffffffff) {
                                  p_Var3 = xlogging_get_log_function();
                                  if (p_Var3 != (LOGGER_LOG)0x0) {
                                    (*p_Var3)(AZ_LOG_ERROR,
                                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                              ,"HTTPAPI_SetOption",0x41c,1,"Invalid malloc size");
                                  }
                                  proxy_data = (HTTP_PROXY_OPTIONS *)0x0;
                                }
                                else {
                                  proxy_data = (HTTP_PROXY_OPTIONS *)malloc(local_160);
                                }
                                if (proxy_data == (HTTP_PROXY_OPTIONS *)0x0) {
                                  p_Var3 = xlogging_get_log_function();
                                  if (p_Var3 != (LOGGER_LOG)0x0) {
                                    (*p_Var3)(AZ_LOG_ERROR,
                                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                              ,"HTTPAPI_SetOption",0x426,1,
                                              "failure allocating proxy authentication");
                                  }
                                  l._4_4_ = HTTPAPI_ERROR;
                                }
                                else {
                                  iVar2 = sprintf_s((char *)proxy_data,0x41,"%s:%s",
                                                    *(undefined8 *)((long)value + 0x10),
                                                    *(undefined8 *)((long)value + 0x18));
                                  if (iVar2 < 1) {
                                    p_Var3 = xlogging_get_log_function();
                                    if (p_Var3 != (LOGGER_LOG)0x0) {
                                      (*p_Var3)(AZ_LOG_ERROR,
                                                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                                ,"HTTPAPI_SetOption",0x42e,1,
                                                "failure constructing proxy authentication");
                                    }
                                    l._4_4_ = HTTPAPI_ERROR;
                                  }
                                  else {
                                    iVar2 = curl_easy_setopt(handle->curl,0x2716,proxy_data);
                                    if (iVar2 == 0) {
                                      l._4_4_ = HTTPAPI_OK;
                                    }
                                    else {
                                      p_Var3 = xlogging_get_log_function();
                                      if (p_Var3 != (LOGGER_LOG)0x0) {
                                        (*p_Var3)(AZ_LOG_ERROR,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                                  ,"HTTPAPI_SetOption",0x435,1,
                                                  "failure setting curl proxy authentication");
                                      }
                                      l._4_4_ = HTTPAPI_ERROR;
                                    }
                                  }
                                  free(proxy_data);
                                }
                              }
                            }
                            else {
                              p_Var3 = xlogging_get_log_function();
                              if (p_Var3 != (LOGGER_LOG)0x0) {
                                (*p_Var3)(AZ_LOG_ERROR,
                                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                          ,"HTTPAPI_SetOption",0x411,1,
                                          "failure setting curl proxy address");
                              }
                              l._4_4_ = HTTPAPI_ERROR;
                            }
                          }
                        }
                        else {
                          iVar2 = strcmp("TrustedCerts",optionName);
                          if (iVar2 == 0) {
                            iVar2 = curl_easy_setopt(handle->curl,0x4e8c,ssl_ctx_callback);
                            if (iVar2 == 0) {
                              iVar2 = curl_easy_setopt(handle->curl,0x277d,handle);
                              if (iVar2 == 0) {
                                handle->certificates = (char *)value;
                                l._4_4_ = HTTPAPI_OK;
                              }
                              else {
                                p_Var3 = xlogging_get_log_function();
                                if (p_Var3 != (LOGGER_LOG)0x0) {
                                  (*p_Var3)(AZ_LOG_ERROR,
                                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                            ,"HTTPAPI_SetOption",0x454,1,
                                            "failure in curl_easy_setopt - CURLOPT_SSL_CTX_DATA");
                                }
                                l._4_4_ = HTTPAPI_ERROR;
                              }
                            }
                            else {
                              p_Var3 = xlogging_get_log_function();
                              if (p_Var3 != (LOGGER_LOG)0x0) {
                                (*p_Var3)(AZ_LOG_ERROR,
                                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                          ,"HTTPAPI_SetOption",0x44d,1,
                                          "failure in curl_easy_setopt - CURLOPT_SSL_CTX_FUNCTION");
                              }
                              l._4_4_ = HTTPAPI_ERROR;
                            }
                          }
                          else {
                            iVar2 = strcmp("CURLOPT_INTERFACE",optionName);
                            if (iVar2 == 0) {
                              if ((value == (void *)0x0) || (*value == '\0')) {
                                p_Var3 = xlogging_get_log_function();
                                if (p_Var3 != (LOGGER_LOG)0x0) {
                                  (*p_Var3)(AZ_LOG_ERROR,
                                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                            ,"HTTPAPI_SetOption",0x46f,1,
                                            "unable to curl_easy_setopt for CURLOPT_INTERFACE option as option-value is invalid/empty"
                                           );
                                }
                                l._4_4_ = HTTPAPI_ERROR;
                              }
                              else {
                                iVar2 = curl_easy_setopt(handle->curl,0x274e,value);
                                if (iVar2 == 0) {
                                  l._4_4_ = HTTPAPI_OK;
                                }
                                else {
                                  p_Var3 = xlogging_get_log_function();
                                  if (p_Var3 != (LOGGER_LOG)0x0) {
                                    (*p_Var3)(AZ_LOG_ERROR,
                                              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                              ,"HTTPAPI_SetOption",0x465,1,
                                              "unable to curl_easy_setopt for CURLOPT_INTERFACE");
                                  }
                                  l._4_4_ = HTTPAPI_ERROR;
                                }
                              }
                            }
                            else {
                              l._4_4_ = HTTPAPI_INVALID_ARG;
                              p_Var3 = xlogging_get_log_function();
                              if (p_Var3 != (LOGGER_LOG)0x0) {
                                (*p_Var3)(AZ_LOG_ERROR,
                                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/httpapi_curl.c"
                                          ,"HTTPAPI_SetOption",0x476,1,"unknown option %s",
                                          optionName);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return l._4_4_;
}

Assistant:

HTTPAPI_RESULT HTTPAPI_SetOption(HTTP_HANDLE handle, const char* optionName, const void* value)
{
    HTTPAPI_RESULT result;
    if (
        (handle == NULL) ||
        (optionName == NULL) ||
        (value == NULL)
        )
    {
        result = HTTPAPI_INVALID_ARG;
        LogError("invalid parameter (NULL) passed to HTTPAPI_SetOption");
    }
    else
    {
        HTTP_HANDLE_DATA* httpHandleData = (HTTP_HANDLE_DATA*)handle;
        if (strcmp(OPTION_HTTP_TIMEOUT, optionName) == 0)
        {
            long timeout = (long)(*(unsigned int*)value);
            httpHandleData->timeout = timeout;
            result = HTTPAPI_OK;
        }
        else if (strcmp(OPTION_CURL_LOW_SPEED_LIMIT, optionName) == 0)
        {
            httpHandleData->lowSpeedLimit = *(const long*)value;
            result = HTTPAPI_OK;
        }
        else if (strcmp(OPTION_CURL_LOW_SPEED_TIME, optionName) == 0)
        {
            httpHandleData->lowSpeedTime = *(const long*)value;
            result = HTTPAPI_OK;
        }
        else if (strcmp(OPTION_CURL_FRESH_CONNECT, optionName) == 0)
        {
            httpHandleData->freshConnect = *(const long*)value;
            result = HTTPAPI_OK;
        }
        else if (strcmp(OPTION_CURL_FORBID_REUSE, optionName) == 0)
        {
            httpHandleData->forbidReuse = *(const long*)value;
            result = HTTPAPI_OK;
        }
        else if (strcmp(OPTION_CURL_VERBOSE, optionName) == 0)
        {
            httpHandleData->verbose = *(const long*)value;
            result = HTTPAPI_OK;
        }
#ifdef USE_OPENSSL
        else if (strcmp(OPTION_OPENSSL_PRIVATE_KEY_TYPE, optionName) == 0)
        {
            const OPTION_OPENSSL_KEY_TYPE type = *(const OPTION_OPENSSL_KEY_TYPE*)value;
            if (type == KEY_TYPE_DEFAULT || type == KEY_TYPE_ENGINE)
            {
                httpHandleData->x509privatekeytype = type;
                result = HTTPAPI_OK;
            }
            else
            {
                LogError("Unknown x509PrivatekeyType: %i", type);
                result = HTTPAPI_ERROR;
            }
        }
#ifndef OPENSSL_NO_ENGINE
        else if (strcmp(OPTION_OPENSSL_ENGINE, optionName) == 0)
        {
            if (mallocAndStrcpy_s((char**)&httpHandleData->engineId, value) != 0)
            {
                LogError("unable to mallocAndStrcpy_s x509PrivatekeyType");
                result = HTTPAPI_ERROR;
            }
            else
            {
                result = HTTPAPI_OK;
            }
        }
#endif // OPENSSL_NO_ENGINE
#endif
        else if (strcmp(SU_OPTION_X509_PRIVATE_KEY, optionName) == 0 || strcmp(OPTION_X509_ECC_KEY, optionName) == 0)
        {
            httpHandleData->x509privatekey = value;
            if (httpHandleData->x509certificate != NULL)
            {
                if (curl_easy_setopt(httpHandleData->curl, CURLOPT_SSL_CTX_FUNCTION, ssl_ctx_callback) != CURLE_OK)
                {
                    LogError("unable to curl_easy_setopt");
                    result = HTTPAPI_ERROR;
                }
                else
                {
                    if (curl_easy_setopt(httpHandleData->curl, CURLOPT_SSL_CTX_DATA, httpHandleData) != CURLE_OK)
                    {
                        LogError("unable to curl_easy_setopt");
                        result = HTTPAPI_ERROR;
                    }
                    else
                    {
                        result = HTTPAPI_OK;
                    }
                }
            }
            else
            {
                /*if privatekey comes 1st and certificate is not set yet, then return OK and wait for the certificate to be set*/
                result = HTTPAPI_OK;
            }
        }
        else if (strcmp(SU_OPTION_X509_CERT, optionName) == 0 || strcmp(OPTION_X509_ECC_CERT, optionName) == 0)
        {
            httpHandleData->x509certificate = value;
            if (httpHandleData->x509privatekey != NULL)
            {
                if (curl_easy_setopt(httpHandleData->curl, CURLOPT_SSL_CTX_FUNCTION, ssl_ctx_callback) != CURLE_OK)
                {
                    LogError("unable to curl_easy_setopt");
                    result = HTTPAPI_ERROR;
                }
                else
                {
                    if (curl_easy_setopt(httpHandleData->curl, CURLOPT_SSL_CTX_DATA, httpHandleData) != CURLE_OK)
                    {
                        LogError("unable to curl_easy_setopt");
                        result = HTTPAPI_ERROR;
                    }
                    else
                    {
                        result = HTTPAPI_OK;
                    }
                }
            }
            else
            {
                /*if certificate comes 1st and private key is not set yet, then return OK and wait for the private key to be set*/
                result = HTTPAPI_OK;
            }
        }
        else if (strcmp(OPTION_HTTP_PROXY, optionName) == 0)
        {
            char proxy[MAX_HOSTNAME_LEN];
            char* proxy_auth;

            HTTP_PROXY_OPTIONS* proxy_data = (HTTP_PROXY_OPTIONS*)value;

            if (sprintf_s(proxy, MAX_HOSTNAME_LEN, "%s:%d", proxy_data->host_address, proxy_data->port) <= 0)
            {
                LogError("failure constructing proxy address");
                result = HTTPAPI_ERROR;
            }
            else
            {
                if (curl_easy_setopt(httpHandleData->curl, CURLOPT_PROXY, proxy) != CURLE_OK)
                {
                    LogError("failure setting curl proxy address");
                    result = HTTPAPI_ERROR;
                }
                else
                {
                    if (proxy_data->username != NULL && proxy_data->password != NULL)
                    {
                        size_t authLen = safe_add_size_t(strlen(proxy_data->username), strlen(proxy_data->password));
                        authLen = safe_add_size_t(authLen, 2);
                        if (authLen == SIZE_MAX)
                        {
                            LogError("Invalid malloc size");
                            proxy_auth = NULL;
                        }
                        else
                        {
                            proxy_auth = malloc(authLen);
                        }

                        if (proxy_auth == NULL)
                        {
                            LogError("failure allocating proxy authentication");
                            result = HTTPAPI_ERROR;
                        }
                        else
                        {
                            // From curl website 'Pass a char * as parameter, which should be [user name]:[password]'
                            if (sprintf_s(proxy_auth, MAX_HOSTNAME_LEN, "%s:%s", proxy_data->username, proxy_data->password) <= 0)
                            {
                                LogError("failure constructing proxy authentication");
                                result = HTTPAPI_ERROR;
                            }
                            else
                            {
                                if (curl_easy_setopt(httpHandleData->curl, CURLOPT_PROXYUSERPWD, proxy_auth) != CURLE_OK)
                                {
                                    LogError("failure setting curl proxy authentication");
                                    result = HTTPAPI_ERROR;
                                }
                                else
                                {
                                    result = HTTPAPI_OK;
                                }
                            }
                            free(proxy_auth);
                            proxy_auth = NULL;
                        }
                    }
                    else
                    {
                        result = HTTPAPI_OK;
                    }
                }
            }
        }
        else if (strcmp("TrustedCerts", optionName) == 0)
        {
            /*TrustedCerts needs to trigger the CURLOPT_SSL_CTX_FUNCTION in curl so we can pass the CAs*/
            if (curl_easy_setopt(httpHandleData->curl, CURLOPT_SSL_CTX_FUNCTION, ssl_ctx_callback) != CURLE_OK)
            {
                LogError("failure in curl_easy_setopt - CURLOPT_SSL_CTX_FUNCTION");
                result = HTTPAPI_ERROR;
            }
            else
            {
                if (curl_easy_setopt(httpHandleData->curl, CURLOPT_SSL_CTX_DATA, httpHandleData) != CURLE_OK)
                {
                    LogError("failure in curl_easy_setopt - CURLOPT_SSL_CTX_DATA");
                    result = HTTPAPI_ERROR;
                }
                else
                {
                    httpHandleData->certificates = (const char*)value;
                    result = HTTPAPI_OK;
                }
            }
        }
        else if (strcmp(OPTION_CURL_INTERFACE, optionName) == 0)
        {
            const char *interfaceName = (const char*)value;
            if (interfaceName != NULL && interfaceName[0] != '\0')
            {
                if (curl_easy_setopt(httpHandleData->curl, CURLOPT_INTERFACE, interfaceName) != CURLE_OK)
                {
                    LogError("unable to curl_easy_setopt for CURLOPT_INTERFACE");
                    result = HTTPAPI_ERROR;
                }
                else
                {
                    result = HTTPAPI_OK;
                }
            }
            else
            {
                LogError("unable to curl_easy_setopt for CURLOPT_INTERFACE option as option-value is invalid/empty");
                result = HTTPAPI_ERROR;
            }
        }
        else
        {
            result = HTTPAPI_INVALID_ARG;
            LogError("unknown option %s", optionName);
        }
    }

    return result;
}